

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O3

ByteArray *
ot::commissioner::CommissionerImpl::GetPendingOperationalDatasetTlvs
          (ByteArray *__return_storage_ptr__,uint16_t aDatasetFlags)

{
  pointer *ppuVar1;
  iterator iVar2;
  uchar local_1a [2];
  
  GetActiveOperationalDatasetTlvs(__return_storage_ptr__,aDatasetFlags);
  if ((aDatasetFlags & 0x20) != 0) {
    local_1a[0] = '4';
    iVar2._M_current =
         (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
                (__return_storage_ptr__,iVar2,local_1a);
    }
    else {
      *iVar2._M_current = '4';
      ppuVar1 = &(__return_storage_ptr__->
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppuVar1 = *ppuVar1 + 1;
    }
  }
  if ((aDatasetFlags & 0x10) != 0) {
    local_1a[1] = 0x33;
    iVar2._M_current =
         (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
                (__return_storage_ptr__,iVar2,local_1a + 1);
    }
    else {
      *iVar2._M_current = '3';
      ppuVar1 = &(__return_storage_ptr__->
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppuVar1 = *ppuVar1 + 1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

ByteArray CommissionerImpl::GetPendingOperationalDatasetTlvs(uint16_t aDatasetFlags)
{
    auto tlvTypes = GetActiveOperationalDatasetTlvs(aDatasetFlags);

    if (aDatasetFlags & PendingOperationalDataset::kDelayTimerBit)
    {
        EncodeTlvType(tlvTypes, tlv::Type::kDelayTimer);
    }
    if (aDatasetFlags & PendingOperationalDataset::kPendingTimestampBit)
    {
        EncodeTlvType(tlvTypes, tlv::Type::kPendingTimestamp);
    }

    return tlvTypes;
}